

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxShape.h
# Opt level: O1

void __thiscall cbtBoxShape::getPlaneEquation(cbtBoxShape *this,cbtVector4 *plane,int i)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  
  if (5 < (uint)i) {
    return;
  }
  auVar2 = ZEXT416((uint)(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
                         m_implicitShapeDimensions.m_floats[0]);
  cVar3 = 0.0;
  switch(i) {
  case 0:
    cVar4 = 1.0;
    cVar3 = 0.0;
    break;
  case 1:
    cVar4 = -1.0;
    cVar3 = 0.0;
    break;
  case 2:
    cVar3 = 1.0;
    goto LAB_008f0d22;
  case 3:
    cVar3 = -1.0;
LAB_008f0d22:
    cVar4 = 0.0;
    auVar2 = ZEXT416((uint)(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
                           m_implicitShapeDimensions.m_floats[1]);
    break;
  case 4:
    cVar5 = 1.0;
    goto LAB_008f0d42;
  case 5:
    cVar5 = -1.0;
LAB_008f0d42:
    cVar4 = 0.0;
    auVar2 = ZEXT416((uint)(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
                           m_implicitShapeDimensions.m_floats[2]);
    goto LAB_008f0d4a;
  }
  cVar5 = 0.0;
LAB_008f0d4a:
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar2 = vxorps_avx512vl(auVar2,auVar1);
  (plane->super_cbtVector3).m_floats[0] = cVar4;
  (plane->super_cbtVector3).m_floats[1] = cVar3;
  (plane->super_cbtVector3).m_floats[2] = cVar5;
  (plane->super_cbtVector3).m_floats[3] = auVar2._0_4_;
  return;
}

Assistant:

virtual void getPlaneEquation(cbtVector4 & plane, int i) const
	{
		cbtVector3 halfExtents = getHalfExtentsWithoutMargin();

		switch (i)
		{
			case 0:
				plane.setValue(cbtScalar(1.), cbtScalar(0.), cbtScalar(0.), -halfExtents.x());
				break;
			case 1:
				plane.setValue(cbtScalar(-1.), cbtScalar(0.), cbtScalar(0.), -halfExtents.x());
				break;
			case 2:
				plane.setValue(cbtScalar(0.), cbtScalar(1.), cbtScalar(0.), -halfExtents.y());
				break;
			case 3:
				plane.setValue(cbtScalar(0.), cbtScalar(-1.), cbtScalar(0.), -halfExtents.y());
				break;
			case 4:
				plane.setValue(cbtScalar(0.), cbtScalar(0.), cbtScalar(1.), -halfExtents.z());
				break;
			case 5:
				plane.setValue(cbtScalar(0.), cbtScalar(0.), cbtScalar(-1.), -halfExtents.z());
				break;
			default:
				cbtAssert(0);
		}
	}